

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

bool __thiscall
GlobOpt::TypeSpecializeIntUnary
          (GlobOpt *this,Instr **pInstr,Value **pSrc1Val,Value **pDstVal,int32 min,int32 max,
          Value *src1OriginalVal,bool *redoTypeSpecRef,bool skipDst)

{
  StackSym *sym_00;
  Instr *pIVar1;
  SparseArray<Value> *src1Value;
  code *pcVar2;
  ValueNumber VVar3;
  int32 bailOutKind_00;
  BailOutKind newMin_00;
  Value **pDstVal_00;
  bool bVar4;
  bool bVar5;
  short sVar6;
  uint uVar7;
  uint uVar8;
  BailOutKind BVar9;
  undefined4 *puVar10;
  Opnd *pOVar11;
  GlobOptBlockData *pGVar12;
  IntConstOpnd *pIVar13;
  ValueInfo *this_00;
  IndirOpnd *this_01;
  RegOpnd *pRVar14;
  Value *pVVar15;
  char16 *pcVar16;
  AddSubConstantInfo *local_168;
  SparseArray<Value> *local_138;
  Opnd *dst;
  Opnd *src1;
  Value *src1ValueToSpecialize;
  Value *pVStack_e0;
  OpCode originalOpCode;
  Value *src2Val;
  Value *src1IndirIndexVal;
  StackSym *local_c8;
  StackSym *sym_1;
  undefined1 auStack_b8 [7];
  bool specialize;
  anon_class_16_2_639d4b01 CannotOverflowBasedOnRelativeBounds_1;
  anon_class_16_2_639d4b01 CannotOverflowBasedOnRelativeBounds;
  StackSym *sym;
  AddSubConstantInfo addSubConstantInfo;
  bool checkTypeSpecWorth;
  bool ignoredNegativeZero;
  bool ignoredIntOverflow;
  BailOutKind bailOutKind;
  BailOutKind BStack_68;
  bool lossy;
  int32 newMax;
  int32 newMin;
  OpCode opcode;
  bool isTransfer;
  Value **src1Val;
  Instr **instr;
  BailOutKind local_48;
  BailOutKind BStack_44;
  bool skipDst_local;
  int32 max_local;
  int32 min_local;
  Value **pDstVal_local;
  Value **pSrc1Val_local;
  Instr **pInstr_local;
  GlobOpt *this_local;
  
  instr._7_1_ = skipDst;
  src1Val = (Value **)pInstr;
  local_48 = max;
  BStack_44 = min;
  _max_local = pDstVal;
  pDstVal_local = pSrc1Val;
  pSrc1Val_local = (Value **)pInstr;
  pInstr_local = (Instr **)this;
  if (pSrc1Val == (Value **)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x1f87,"(pSrc1Val)","pSrc1Val");
    if (!bVar4) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar10 = 0;
  }
  _newMin = (GlobOpt *)pDstVal_local;
  newMax._3_1_ = 0;
  bVar4 = false;
  addSubConstantInfo.offset = 0;
  addSubConstantInfo._19_1_ = (byte)(*(uint *)&this->field_0xf4 >> 2) & 1;
  addSubConstantInfo._18_1_ = 0;
  addSubConstantInfo._17_1_ = 0;
  pOVar11 = IR::Instr::GetSrc1((Instr *)*src1Val);
  bVar5 = IR::Opnd::IsRegOpnd(pOVar11);
  if (bVar5) {
    pOVar11 = IR::Instr::GetSrc1((Instr *)*src1Val);
    pRVar14 = IR::Opnd::AsRegOpnd(pOVar11);
    if ((*(uint *)&pRVar14->m_sym->field_0x18 >> 1 & 1) != 0) {
      bVar4 = TryTypeSpecializeUnaryToFloatHelper
                        (this,(Instr **)pSrc1Val_local,(Value **)_newMin,src1OriginalVal,_max_local)
      ;
      return bVar4;
    }
  }
  AddSubConstantInfo::AddSubConstantInfo((AddSubConstantInfo *)&sym);
  sVar6 = (short)(*src1Val)[3].valueNumber;
  if ((ushort)(sVar6 - 0xeU) < 2) {
    bVar5 = DoConstFold(this);
    if (((bVar5) && (bVar5 = IsLoopPrePass(this), !bVar5)) &&
       (bVar5 = TryOptConstFoldBrFalse
                          (this,(Instr *)*src1Val,(Value *)_newMin->byteCodeConstantValueArray,
                           BStack_44,local_48), bVar5)) {
      return true;
    }
    sym_1._7_1_ = 1;
    this_00 = ::Value::GetValueInfo((Value *)_newMin->byteCodeConstantValueArray);
    bVar5 = ValueInfo::HasIntConstantValue(this_00,false);
    if (!bVar5) {
      pOVar11 = IR::Instr::GetSrc1((Instr *)*src1Val);
      bVar5 = IR::Opnd::IsRegOpnd(pOVar11);
      if (bVar5) {
        pOVar11 = IR::Instr::GetSrc1((Instr *)*src1Val);
        pRVar14 = IR::Opnd::AsRegOpnd(pOVar11);
        local_c8 = pRVar14->m_sym;
        pGVar12 = CurrentBlockData(this);
        bVar5 = GlobOptBlockData::IsInt32TypeSpecialized(pGVar12,&local_c8->super_Sym);
        if (!bVar5) {
          sym_1._7_1_ = 0;
        }
      }
    }
    if ((short)(*src1Val)[3].valueNumber == 0xf) {
      UpdateIntBoundsForNotEqualBranch
                (this,(Value *)_newMin->byteCodeConstantValueArray,(Value *)0x0,0);
      newMax._0_2_ = 0x1a6;
    }
    else {
      UpdateIntBoundsForEqualBranch
                (this,(Value *)_newMin->byteCodeConstantValueArray,(Value *)0x0,0);
      newMax._0_2_ = 0x1a7;
    }
    if ((sym_1._7_1_ & 1) == 0) {
      return false;
    }
    BStack_68 = BailOutNumberOnly;
    bailOutKind = BailOutIntOnly;
    goto LAB_005a23a6;
  }
  if (sVar6 == 0x24) {
    return false;
  }
  if (sVar6 != 0x26) {
    if (sVar6 != 0x27) {
      if (sVar6 == 0x28) {
        if (((int)BStack_44 < 1) && (-1 < (int)local_48)) {
          bVar5 = IR::Instr::ShouldCheckForNegativeZero((Instr *)*src1Val);
          if (bVar5) {
            bVar5 = DoAggressiveIntTypeSpec(this);
            if (!bVar5) {
              bVar4 = TryTypeSpecializeUnaryToFloatHelper
                                (this,(Instr **)pSrc1Val_local,(Value **)_newMin,src1OriginalVal,
                                 _max_local);
              return bVar4;
            }
            if ((BStack_44 == BailOutInvalid) && (local_48 == BailOutInvalid)) {
              bVar4 = TryTypeSpecializeUnaryToFloatHelper
                                (this,(Instr **)pSrc1Val_local,(Value **)_newMin,src1OriginalVal,
                                 _max_local);
              return bVar4;
            }
            IR::operator|=((BailOutKind *)&addSubConstantInfo.offset,BailOutOnNegativeZero);
          }
          else {
            addSubConstantInfo._18_1_ = 1;
          }
        }
        bVar5 = IntMathCommon<int>::Neg(BStack_44,(int *)&bailOutKind);
        if (bVar5) {
          bVar5 = IR::Instr::ShouldCheckForIntOverflow((Instr *)*src1Val);
          if (bVar5) {
            bVar5 = DoAggressiveIntTypeSpec(this);
            if (!bVar5) {
              bVar4 = TryTypeSpecializeUnaryToFloatHelper
                                (this,(Instr **)pSrc1Val_local,(Value **)_newMin,src1OriginalVal,
                                 _max_local);
              return bVar4;
            }
            if (BStack_44 == local_48) {
              bVar4 = TryTypeSpecializeUnaryToFloatHelper
                                (this,(Instr **)pSrc1Val_local,(Value **)_newMin,src1OriginalVal,
                                 _max_local);
              return bVar4;
            }
            IR::operator|=((BailOutKind *)&addSubConstantInfo.offset,BailOutOnOverflow);
            bailOutKind = ~LazyBailOut;
          }
          else {
            addSubConstantInfo._19_1_ = 1;
          }
        }
        bVar5 = IntMathCommon<int>::Neg(local_48,(int *)&stack0xffffffffffffff98);
        if (bVar5) {
          bVar5 = IR::Instr::ShouldCheckForIntOverflow((Instr *)*src1Val);
          if (bVar5) {
            bVar5 = DoAggressiveIntTypeSpec(this);
            if (!bVar5) {
              bVar4 = TryTypeSpecializeUnaryToFloatHelper
                                (this,(Instr **)pSrc1Val_local,(Value **)_newMin,src1OriginalVal,
                                 _max_local);
              return bVar4;
            }
            IR::operator|=((BailOutKind *)&addSubConstantInfo.offset,BailOutOnOverflow);
            BStack_68 = ~LazyBailOut;
          }
          else {
            addSubConstantInfo._19_1_ = 1;
          }
        }
        bVar5 = IR::Instr::ShouldCheckForIntOverflow((Instr *)*src1Val);
        if ((!bVar5) && ((int)bailOutKind < (int)BStack_68)) {
          BStack_68 = LazyBailOut;
          bailOutKind = ~LazyBailOut;
        }
        newMax._0_2_ = 0x1be;
        addSubConstantInfo._17_1_ = 1;
      }
      else if (sVar6 == 0x29) {
        bVar4 = DoLossyIntTypeSpec(this);
        if (!bVar4) {
          return false;
        }
        PropagateIntRangeForNot
                  (this,BStack_44,local_48,(int32 *)&stack0xffffffffffffff98,(int32 *)&bailOutKind);
        newMax._0_2_ = 0x1bf;
        bVar4 = true;
      }
      else if (sVar6 == 0x43) {
        BStack_68 = BStack_44;
        bailOutKind = local_48;
        newMax._0_2_ = 0x1e4;
        newMax._3_1_ = 1;
      }
      else {
        if (sVar6 != 0x45) {
          if (((((sVar6 != 0x59) && (sVar6 != 0x70)) && (sVar6 != 0x72)) &&
              ((sVar6 != 0x76 && (sVar6 != 0x78)))) && ((sVar6 != 0x7a && (sVar6 != 0x7e)))) {
            if ((sVar6 == 0x9a) || (sVar6 == 0x9c)) {
LAB_005a22f4:
              pOVar11 = IR::Instr::GetDst((Instr *)*src1Val);
              this_01 = IR::Opnd::AsIndirOpnd(pOVar11);
              pRVar14 = IR::IndirOpnd::GetBaseOpnd(this_01);
              src1IndirIndexVal._6_2_ =
                   (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                   IR::Opnd::GetValueType(&pRVar14->super_Opnd);
              bVar4 = ValueType::IsLikelyAnyArrayWithNativeFloatValues
                                ((ValueType *)((long)&src1IndirIndexVal + 6));
              if (bVar4) {
                _newMin->byteCodeConstantValueArray = (SparseArray<Value> *)src1OriginalVal;
              }
              bVar4 = TypeSpecializeStElem
                                (this,(Instr **)pSrc1Val_local,
                                 (Value *)_newMin->byteCodeConstantValueArray,_max_local);
              return bVar4;
            }
            if ((1 < (ushort)(sVar6 - 0xbeU)) && ((sVar6 != 0xcf && (sVar6 != 0xd1)))) {
              if (sVar6 == 0x18b) {
                BStack_68 = BStack_44;
                bailOutKind = local_48;
                newMax._0_2_ = (undefined2)(*src1Val)[3].valueNumber;
              }
              else if (sVar6 == 0x1e5) {
                pOVar11 = IR::Instr::GetSrc1((Instr *)*src1Val);
                pIVar13 = IR::Opnd::AsIntConstOpnd(pOVar11);
                bailOutKind = IR::IntConstOpnd::AsInt32(pIVar13);
                newMax._0_2_ = 0x1e4;
                BStack_68 = bailOutKind;
              }
              else {
                if (sVar6 == 0x1ed) {
                  return false;
                }
                if ((ushort)(sVar6 - 0x1f0U) < 4) {
                  return false;
                }
                if ((ushort)(sVar6 - 0x1f7U) < 2) {
                  return false;
                }
                if (sVar6 == 0x22c) goto LAB_005a22f4;
                bVar5 = OpCodeAttr::IsInlineBuiltIn((OpCode)(*src1Val)[3].valueNumber);
                if (!bVar5) {
                  return false;
                }
                BStack_68 = BStack_44;
                bailOutKind = local_48;
                newMax._0_2_ = (undefined2)(*src1Val)[3].valueNumber;
              }
              goto LAB_005a23a6;
            }
          }
          return false;
        }
        pOVar11 = IR::Instr::GetSrc1((Instr *)*src1Val);
        bVar5 = IR::Opnd::IsRegOpnd(pOVar11);
        if (bVar5) {
          pOVar11 = IR::Instr::GetSrc1((Instr *)*src1Val);
          pRVar14 = IR::Opnd::AsRegOpnd(pOVar11);
          sym_00 = pRVar14->m_sym;
          pGVar12 = CurrentBlockData(this);
          bVar5 = GlobOptBlockData::IsInt32TypeSpecialized(pGVar12,&sym_00->super_Sym);
          if (!bVar5) {
            return false;
          }
        }
        BStack_68 = BStack_44;
        bailOutKind = local_48;
        newMax._0_2_ = 0x1e4;
        newMax._3_1_ = 1;
      }
      goto LAB_005a23a6;
    }
    _auStack_b8 = _newMin;
    CannotOverflowBasedOnRelativeBounds_1.src1Val = (Value **)this;
    bVar5 = IntMathCommon<int>::Dec(local_48,(int *)&bailOutKind);
    if (bVar5) {
      bVar5 = TypeSpecializeIntUnary::anon_class_16_2_639d4b01::operator()
                        ((anon_class_16_2_639d4b01 *)auStack_b8);
      if (bVar5) {
        bailOutKind = LazyBailOut;
        goto LAB_005a2026;
      }
      bVar5 = IR::Instr::ShouldCheckForIntOverflow((Instr *)*src1Val);
      if (bVar5) {
        bVar4 = TryTypeSpecializeUnaryToFloatHelper
                          (this,(Instr **)pSrc1Val_local,(Value **)_newMin,src1OriginalVal,
                           _max_local);
        return bVar4;
      }
      addSubConstantInfo._19_1_ = 1;
      BStack_68 = LazyBailOut;
      bailOutKind = ~LazyBailOut;
    }
    else {
LAB_005a2026:
      bVar5 = IntMathCommon<int>::Dec(BStack_44,(int *)&stack0xffffffffffffff98);
      if (bVar5) {
        bVar5 = TypeSpecializeIntUnary::anon_class_16_2_639d4b01::operator()
                          ((anon_class_16_2_639d4b01 *)auStack_b8);
        if (!bVar5) {
          bVar5 = IR::Instr::ShouldCheckForIntOverflow((Instr *)*src1Val);
          if (!bVar5) {
            addSubConstantInfo._19_1_ = 1;
            BStack_68 = LazyBailOut;
            bailOutKind = ~LazyBailOut;
            goto LAB_005a20cf;
          }
          bVar5 = DoAggressiveIntTypeSpec(this);
          if (!bVar5) {
            bVar4 = TryTypeSpecializeUnaryToFloatHelper
                              (this,(Instr **)pSrc1Val_local,(Value **)_newMin,src1OriginalVal,
                               _max_local);
            return bVar4;
          }
          IR::operator|=((BailOutKind *)&addSubConstantInfo.offset,BailOutOnOverflow);
        }
        BStack_68 = LazyBailOut;
      }
    }
LAB_005a20cf:
    if ((addSubConstantInfo._19_1_ & 1) == 0) {
      pOVar11 = IR::Instr::GetSrc1((Instr *)*src1Val);
      bVar5 = IR::Opnd::IsRegOpnd(pOVar11);
      if (bVar5) {
        pOVar11 = IR::Instr::GetSrc1((Instr *)*src1Val);
        pRVar14 = IR::Opnd::AsRegOpnd(pOVar11);
        AddSubConstantInfo::Set
                  ((AddSubConstantInfo *)&sym,pRVar14->m_sym,
                   (Value *)_newMin->byteCodeConstantValueArray,BStack_44 == local_48,-1);
      }
    }
    newMax._0_2_ = 0x1c1;
    bVar5 = IsLoopPrePass(this);
    if (!bVar5) {
      pIVar1 = (Instr *)*src1Val;
      pIVar13 = IR::IntConstOpnd::New(1,TyInt32,*(Func **)(*src1Val + 2),false);
      IR::Instr::SetSrc2(pIVar1,&pIVar13->super_Opnd);
    }
    addSubConstantInfo._17_1_ = 1;
    goto LAB_005a23a6;
  }
  CannotOverflowBasedOnRelativeBounds_1.this = _newMin;
  bVar5 = IntMathCommon<int>::Inc(BStack_44,(int *)&stack0xffffffffffffff98);
  if (bVar5) {
    bVar5 = TypeSpecializeIntUnary::anon_class_16_2_639d4b01::operator()
                      ((anon_class_16_2_639d4b01 *)&CannotOverflowBasedOnRelativeBounds_1.this);
    if (bVar5) {
      BStack_68 = ~LazyBailOut;
      goto LAB_005a1e2c;
    }
    bVar5 = IR::Instr::ShouldCheckForIntOverflow((Instr *)*src1Val);
    if (bVar5) {
      bVar4 = TryTypeSpecializeUnaryToFloatHelper
                        (this,(Instr **)pSrc1Val_local,(Value **)_newMin,src1OriginalVal,_max_local)
      ;
      return bVar4;
    }
    addSubConstantInfo._19_1_ = 1;
    BStack_68 = LazyBailOut;
    bailOutKind = ~LazyBailOut;
  }
  else {
LAB_005a1e2c:
    bVar5 = IntMathCommon<int>::Inc(local_48,(int *)&bailOutKind);
    if (bVar5) {
      bVar5 = TypeSpecializeIntUnary::anon_class_16_2_639d4b01::operator()
                        ((anon_class_16_2_639d4b01 *)&CannotOverflowBasedOnRelativeBounds_1.this);
      if (!bVar5) {
        bVar5 = IR::Instr::ShouldCheckForIntOverflow((Instr *)*src1Val);
        if (!bVar5) {
          addSubConstantInfo._19_1_ = 1;
          BStack_68 = LazyBailOut;
          bailOutKind = ~LazyBailOut;
          goto LAB_005a1ed5;
        }
        bVar5 = DoAggressiveIntTypeSpec(this);
        if (!bVar5) {
          bVar4 = TryTypeSpecializeUnaryToFloatHelper
                            (this,(Instr **)pSrc1Val_local,(Value **)_newMin,src1OriginalVal,
                             _max_local);
          return bVar4;
        }
        IR::operator|=((BailOutKind *)&addSubConstantInfo.offset,BailOutOnOverflow);
      }
      bailOutKind = ~LazyBailOut;
    }
  }
LAB_005a1ed5:
  if ((addSubConstantInfo._19_1_ & 1) == 0) {
    pOVar11 = IR::Instr::GetSrc1((Instr *)*src1Val);
    bVar5 = IR::Opnd::IsRegOpnd(pOVar11);
    if (bVar5) {
      pOVar11 = IR::Instr::GetSrc1((Instr *)*src1Val);
      pRVar14 = IR::Opnd::AsRegOpnd(pOVar11);
      AddSubConstantInfo::Set
                ((AddSubConstantInfo *)&sym,pRVar14->m_sym,
                 (Value *)_newMin->byteCodeConstantValueArray,BStack_44 == local_48,1);
    }
  }
  newMax._0_2_ = 0x1c0;
  bVar5 = IsLoopPrePass(this);
  if (!bVar5) {
    pIVar1 = (Instr *)*src1Val;
    pIVar13 = IR::IntConstOpnd::New(1,TyInt32,*(Func **)(*src1Val + 2),false);
    IR::Instr::SetSrc2(pIVar1,&pIVar13->super_Opnd);
  }
  addSubConstantInfo._17_1_ = 1;
LAB_005a23a6:
  if (((((addSubConstantInfo._17_1_ & 1) == 0) || ((addSubConstantInfo._19_1_ & 1) != 0)) ||
      ((addSubConstantInfo._18_1_ & 1) != 0)) ||
     ((bVar5 = IR::Instr::ShouldCheckForIntOverflow((Instr *)*src1Val), !bVar5 ||
      (bVar5 = IsWorthSpecializingToInt32
                         (this,(Instr *)*src1Val,(Value *)_newMin->byteCodeConstantValueArray,
                          (Value *)0x0), bVar5)))) {
    *(uint *)&this->field_0xf4 =
         *(uint *)&this->field_0xf4 & 0xfffffffb | (uint)(addSubConstantInfo._19_1_ & 1) << 2;
    *(uint *)&this->field_0xf4 =
         *(uint *)&this->field_0xf4 & 0xfffffff7 | (uint)(addSubConstantInfo._18_1_ & 1) << 3;
    src2Val = (Value *)0x0;
    pVStack_e0 = (Value *)0x0;
    bVar5 = CSEOptimize(this,this->currentBlock,(Instr **)src1Val,(Value **)_newMin,
                        &stack0xffffffffffffff20,&src2Val,true);
    if (bVar5) {
      *redoTypeSpecRef = true;
      this_local._7_1_ = false;
    }
    else {
      VVar3 = (*src1Val)[3].valueNumber;
      bVar5 = IsLoopPrePass(this);
      if (!bVar5) {
        *(undefined2 *)&(*src1Val)[3].valueNumber = (undefined2)newMax;
      }
      src1 = (Opnd *)_newMin->byteCodeConstantValueArray;
      if (bVar4 != false) {
        src1 = (Opnd *)src1OriginalVal;
      }
      pOVar11 = IR::Instr::GetSrc1((Instr *)*src1Val);
      ToInt32(this,(Instr *)*src1Val,pOVar11,this->currentBlock,(Value *)src1,(IndirOpnd *)0x0,bVar4
             );
      if ((addSubConstantInfo.offset != 0) && (bVar4 = IsLoopPrePass(this), !bVar4)) {
        GenerateBailAtOperation(this,(Instr **)src1Val,addSubConstantInfo.offset);
      }
      if (((instr._7_1_ & 1) == 0) &&
         (pOVar11 = IR::Instr::GetDst((Instr *)*src1Val), pOVar11 != (Opnd *)0x0)) {
        if ((((newMax._3_1_ & 1) != 0) && (bVar4 = IsLoopPrePass(this), !bVar4)) &&
           ((BStack_44 != BStack_68 || (local_48 != bailOutKind)))) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar10 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0x214a,
                             "(!(isTransfer && !this->IsLoopPrePass()) || min == newMin && max == newMax)"
                             ,"If this is just a copy, old/new min/max should be the same");
          if (!bVar4) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar10 = 0;
        }
        pDstVal_00 = _max_local;
        newMin_00 = BStack_68;
        BVar9 = bailOutKind;
        bailOutKind_00 = addSubConstantInfo.offset;
        pIVar1 = (Instr *)*src1Val;
        if ((newMax._3_1_ & 1) == 0) {
          local_138 = (SparseArray<Value> *)0x0;
        }
        else {
          local_138 = _newMin->byteCodeConstantValueArray;
        }
        src1Value = _newMin->byteCodeConstantValueArray;
        bVar4 = AddSubConstantInfo::HasInfo((AddSubConstantInfo *)&sym);
        if (bVar4) {
          local_168 = (AddSubConstantInfo *)&sym;
        }
        else {
          local_168 = (AddSubConstantInfo *)0x0;
        }
        TypeSpecializeIntDst
                  (this,pIVar1,(OpCode)VVar3,(Value *)local_138,(Value *)src1Value,(Value *)0x0,
                   bailOutKind_00,newMin_00,BVar9,pDstVal_00,local_168);
      }
      if (addSubConstantInfo.offset == 0) {
        uVar7 = Func::GetSourceContextId(this->func);
        uVar8 = Func::GetLocalFunctionId(this->func);
        bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,GlobOptPhase,uVar7,uVar8);
        if (bVar4) {
          Output::Print(L"TRACE ");
          bVar4 = IsLoopPrePass(this);
          if (bVar4) {
            Output::Print(L"[%d, %d]",(ulong)(this->rootLoopPrePass->loopNumber - 1),
                          (ulong)(this->prePassLoop->loopNumber - 1));
          }
          Output::Print(L": ");
          Output::Print(L"Type specialized to INT\n");
          Output::Flush();
        }
        bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,AggressiveIntTypeSpecPhase);
        if (bVar4) {
          Output::Print(L"Type specialized to INT: ");
          pcVar16 = Js::OpCodeUtil::GetOpCodeName((OpCode)(*src1Val)[3].valueNumber);
          Output::Print(L"%s \n",pcVar16);
        }
      }
      else {
        uVar7 = Func::GetSourceContextId(this->func);
        uVar8 = Func::GetLocalFunctionId(this->func);
        bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,GlobOptPhase,uVar7,uVar8);
        if (bVar4) {
          Output::Print(L"TRACE ");
          bVar4 = IsLoopPrePass(this);
          if (bVar4) {
            Output::Print(L"[%d, %d]",(ulong)(this->rootLoopPrePass->loopNumber - 1),
                          (ulong)(this->prePassLoop->loopNumber - 1));
          }
          Output::Print(L": ");
          Output::Print(L"Type specialized to INT with bailout on:\n");
          Output::Flush();
        }
        BVar9 = IR::operator&(addSubConstantInfo.offset,BailOutOnOverflow);
        if (BVar9 != BailOutInvalid) {
          uVar7 = Func::GetSourceContextId(this->func);
          uVar8 = Func::GetLocalFunctionId(this->func);
          bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,GlobOptPhase,uVar7,uVar8);
          if (bVar4) {
            Output::Print(L"TRACE ");
            bVar4 = IsLoopPrePass(this);
            if (bVar4) {
              Output::Print(L"[%d, %d]",(ulong)(this->rootLoopPrePass->loopNumber - 1),
                            (ulong)(this->prePassLoop->loopNumber - 1));
            }
            Output::Print(L": ");
            Output::Print(L"    Overflow\n");
            Output::Flush();
          }
          bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,AggressiveIntTypeSpecPhase);
          if (bVar4) {
            Output::Print(L"Type specialized to INT with bailout (%S): ","Overflow");
            pcVar16 = Js::OpCodeUtil::GetOpCodeName((OpCode)(*src1Val)[3].valueNumber);
            Output::Print(L"%s \n",pcVar16);
          }
        }
        BVar9 = IR::operator&(addSubConstantInfo.offset,BailOutOnNegativeZero);
        if (BVar9 != BailOutInvalid) {
          uVar7 = Func::GetSourceContextId(this->func);
          uVar8 = Func::GetLocalFunctionId(this->func);
          bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,GlobOptPhase,uVar7,uVar8);
          if (bVar4) {
            Output::Print(L"TRACE ");
            bVar4 = IsLoopPrePass(this);
            if (bVar4) {
              Output::Print(L"[%d, %d]",(ulong)(this->rootLoopPrePass->loopNumber - 1),
                            (ulong)(this->prePassLoop->loopNumber - 1));
            }
            Output::Print(L": ");
            Output::Print(L"    Zero\n");
            Output::Flush();
          }
          bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01ec73f0,AggressiveIntTypeSpecPhase);
          if (bVar4) {
            Output::Print(L"Type specialized to INT with bailout (%S): ","Zero");
            pcVar16 = Js::OpCodeUtil::GetOpCodeName((OpCode)(*src1Val)[3].valueNumber);
            Output::Print(L"%s \n",pcVar16);
          }
        }
      }
      this_local._7_1_ = true;
    }
  }
  else {
    if (((addSubConstantInfo.offset == 0) &&
        (pOVar11 = IR::Instr::GetDst((Instr *)*src1Val), pOVar11 != (Opnd *)0x0)) &&
       ((bVar4 = DoAggressiveIntTypeSpec(this), bVar4 || (bVar4 = IsLoopPrePass(this), !bVar4)))) {
      pVVar15 = CreateDstUntransferredIntValue
                          (this,BStack_68,bailOutKind,(Instr *)*src1Val,
                           (Value *)_newMin->byteCodeConstantValueArray,(Value *)0x0);
      *_max_local = pVVar15;
    }
    pOVar11 = IR::Instr::GetSrc2((Instr *)*src1Val);
    if (pOVar11 != (Opnd *)0x0) {
      IR::Instr::FreeSrc2((Instr *)*src1Val);
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool
GlobOpt::TypeSpecializeIntUnary(
    IR::Instr **pInstr,
    Value **pSrc1Val,
    Value **pDstVal,
    int32 min,
    int32 max,
    Value *const src1OriginalVal,
    bool *redoTypeSpecRef,
    bool skipDst /* = false */)
{
    IR::Instr *&instr = *pInstr;

    Assert(pSrc1Val);
    Value *&src1Val = *pSrc1Val;

    bool isTransfer = false;
    Js::OpCode opcode;
    int32 newMin, newMax;
    bool lossy = false;
    IR::BailOutKind bailOutKind = IR::BailOutInvalid;
    bool ignoredIntOverflow = this->ignoredIntOverflowForCurrentInstr;
    bool ignoredNegativeZero = false;
    bool checkTypeSpecWorth = false;

    if(instr->GetSrc1()->IsRegOpnd() && instr->GetSrc1()->AsRegOpnd()->m_sym->m_isNotNumber)
    {
        return TryTypeSpecializeUnaryToFloatHelper(pInstr, &src1Val, src1OriginalVal, pDstVal);
    }

    AddSubConstantInfo addSubConstantInfo;

    switch(instr->m_opcode)
    {
    case Js::OpCode::Ld_A:
        if (instr->GetSrc1()->IsRegOpnd())
        {
            StackSym *sym = instr->GetSrc1()->AsRegOpnd()->m_sym;
            if (CurrentBlockData()->IsInt32TypeSpecialized(sym) == false)
            {
                // Type specializing an Ld_A isn't worth it, unless the src
                // is already type specialized.
                return false;
            }
        }
        newMin = min;
        newMax = max;
        opcode = Js::OpCode::Ld_I4;
        isTransfer = true;
        break;

    case Js::OpCode::Conv_Num:
        newMin = min;
        newMax = max;
        opcode = Js::OpCode::Ld_I4;
        isTransfer = true;
        break;

    case Js::OpCode::LdC_A_I4:
        newMin = newMax = instr->GetSrc1()->AsIntConstOpnd()->AsInt32();
        opcode = Js::OpCode::Ld_I4;
        break;

    case Js::OpCode::Neg_A:
        if (min <= 0 && max >= 0)
        {
            if(instr->ShouldCheckForNegativeZero())
            {
                // -0 matters since the sym is not a local, or is used in a way in which -0 would differ from +0
                if(!DoAggressiveIntTypeSpec())
                {
                    // May result in -0
                    // Consider adding a dynamic check for src1 == 0
                    return TryTypeSpecializeUnaryToFloatHelper(pInstr, &src1Val, src1OriginalVal, pDstVal);
                }
                if(min == 0 && max == 0)
                {
                    // Always results in -0
                    return TryTypeSpecializeUnaryToFloatHelper(pInstr, &src1Val, src1OriginalVal, pDstVal);
                }
                bailOutKind |= IR::BailOutOnNegativeZero;
            }
            else
            {
                ignoredNegativeZero = true;
            }
        }
        if (Int32Math::Neg(min, &newMax))
        {
            if(instr->ShouldCheckForIntOverflow())
            {
                if(!DoAggressiveIntTypeSpec())
                {
                    // May overflow
                    return TryTypeSpecializeUnaryToFloatHelper(pInstr, &src1Val, src1OriginalVal, pDstVal);
                }
                if(min == max)
                {
                    // Always overflows
                    return TryTypeSpecializeUnaryToFloatHelper(pInstr, &src1Val, src1OriginalVal, pDstVal);
                }
                bailOutKind |= IR::BailOutOnOverflow;
                newMax = INT32_MAX;
            }
            else
            {
                ignoredIntOverflow = true;
            }
        }
        if (Int32Math::Neg(max, &newMin))
        {
            if(instr->ShouldCheckForIntOverflow())
            {
                if(!DoAggressiveIntTypeSpec())
                {
                    // May overflow
                    return TryTypeSpecializeUnaryToFloatHelper(pInstr, &src1Val, src1OriginalVal, pDstVal);
                }
                bailOutKind |= IR::BailOutOnOverflow;
                newMin = INT32_MAX;
            }
            else
            {
                ignoredIntOverflow = true;
            }
        }
        if(!instr->ShouldCheckForIntOverflow() && newMin > newMax)
        {
            // When ignoring overflow, the range needs to account for overflow. Since MIN_INT is the only int32 value that
            // overflows on Neg, and the value resulting from overflow is also MIN_INT, if calculating only the new min or new
            // max overflowed but not both, then the new min will be greater than the new max. In that case we need to consider
            // the full range of int32s as possible resulting values.
            newMin = INT32_MIN;
            newMax = INT32_MAX;
        }
        opcode = Js::OpCode::Neg_I4;
        checkTypeSpecWorth = true;
        break;

    case Js::OpCode::Not_A:
        if(!DoLossyIntTypeSpec())
        {
            return false;
        }
        this->PropagateIntRangeForNot(min, max, &newMin, &newMax);
        opcode = Js::OpCode::Not_I4;
        lossy = true;
        break;

    case Js::OpCode::Incr_A:
        do // while(false)
        {
            const auto CannotOverflowBasedOnRelativeBounds = [&]()
            {
                const ValueInfo *const src1ValueInfo = src1Val->GetValueInfo();
                return
                    (src1ValueInfo->IsInt() || DoAggressiveIntTypeSpec()) &&
                    src1ValueInfo->IsIntBounded() &&
                    src1ValueInfo->AsIntBounded()->Bounds()->AddCannotOverflowBasedOnRelativeBounds(1);
            };

            if (Int32Math::Inc(min, &newMin))
            {
                if(CannotOverflowBasedOnRelativeBounds())
                {
                    newMin = INT32_MAX;
                }
                else if(instr->ShouldCheckForIntOverflow())
                {
                    // Always overflows
                    return TryTypeSpecializeUnaryToFloatHelper(pInstr, &src1Val, src1OriginalVal, pDstVal);
                }
                else
                {
                    // When ignoring overflow, the range needs to account for overflow. For any Add or Sub, since overflow
                    // causes the value to wrap around, and we don't have a way to specify a lower and upper range of ints,
                    // we use the full range of int32s.
                    ignoredIntOverflow = true;
                    newMin = INT32_MIN;
                    newMax = INT32_MAX;
                    break;
                }
            }
            if (Int32Math::Inc(max, &newMax))
            {
                if(CannotOverflowBasedOnRelativeBounds())
                {
                    newMax = INT32_MAX;
                }
                else if(instr->ShouldCheckForIntOverflow())
                {
                    if(!DoAggressiveIntTypeSpec())
                    {
                        // May overflow
                        return TryTypeSpecializeUnaryToFloatHelper(pInstr, &src1Val, src1OriginalVal, pDstVal);
                    }
                    bailOutKind |= IR::BailOutOnOverflow;
                    newMax = INT32_MAX;
                }
                else
                {
                    // See comment about ignoring overflow above
                    ignoredIntOverflow = true;
                    newMin = INT32_MIN;
                    newMax = INT32_MAX;
                    break;
                }
            }
        } while(false);

        if(!ignoredIntOverflow && instr->GetSrc1()->IsRegOpnd())
        {
            addSubConstantInfo.Set(instr->GetSrc1()->AsRegOpnd()->m_sym, src1Val, min == max, 1);
        }

        opcode = Js::OpCode::Add_I4;
        if (!this->IsLoopPrePass())
        {
            instr->SetSrc2(IR::IntConstOpnd::New(1, TyInt32, instr->m_func));
        }
        checkTypeSpecWorth = true;
        break;

    case Js::OpCode::Decr_A:
        do // while(false)
        {
            const auto CannotOverflowBasedOnRelativeBounds = [&]()
            {
                const ValueInfo *const src1ValueInfo = src1Val->GetValueInfo();
                return
                    (src1ValueInfo->IsInt() || DoAggressiveIntTypeSpec()) &&
                    src1ValueInfo->IsIntBounded() &&
                    src1ValueInfo->AsIntBounded()->Bounds()->SubCannotOverflowBasedOnRelativeBounds(1);
            };

            if (Int32Math::Dec(max, &newMax))
            {
                if(CannotOverflowBasedOnRelativeBounds())
                {
                    newMax = INT32_MIN;
                }
                else if(instr->ShouldCheckForIntOverflow())
                {
                    // Always overflows
                    return TryTypeSpecializeUnaryToFloatHelper(pInstr, &src1Val, src1OriginalVal, pDstVal);
                }
                else
                {
                    // When ignoring overflow, the range needs to account for overflow. For any Add or Sub, since overflow
                    // causes the value to wrap around, and we don't have a way to specify a lower and upper range of ints, we
                    // use the full range of int32s.
                    ignoredIntOverflow = true;
                    newMin = INT32_MIN;
                    newMax = INT32_MAX;
                    break;
                }
            }
            if (Int32Math::Dec(min, &newMin))
            {
                if(CannotOverflowBasedOnRelativeBounds())
                {
                    newMin = INT32_MIN;
                }
                else if(instr->ShouldCheckForIntOverflow())
                {
                    if(!DoAggressiveIntTypeSpec())
                    {
                        // May overflow
                        return TryTypeSpecializeUnaryToFloatHelper(pInstr, &src1Val, src1OriginalVal, pDstVal);
                    }
                    bailOutKind |= IR::BailOutOnOverflow;
                    newMin = INT32_MIN;
                }
                else
                {
                    // See comment about ignoring overflow above
                    ignoredIntOverflow = true;
                    newMin = INT32_MIN;
                    newMax = INT32_MAX;
                    break;
                }
            }
        } while(false);

        if(!ignoredIntOverflow && instr->GetSrc1()->IsRegOpnd())
        {
            addSubConstantInfo.Set(instr->GetSrc1()->AsRegOpnd()->m_sym, src1Val, min == max, -1);
        }

        opcode = Js::OpCode::Sub_I4;
        if (!this->IsLoopPrePass())
        {
            instr->SetSrc2(IR::IntConstOpnd::New(1, TyInt32, instr->m_func));
        }
        checkTypeSpecWorth = true;
        break;

    case Js::OpCode::BrFalse_A:
    case Js::OpCode::BrTrue_A:
    {
        if(DoConstFold() && !IsLoopPrePass() && TryOptConstFoldBrFalse(instr, src1Val, min, max))
        {
            return true;
        }

        bool specialize = true;
        if (!src1Val->GetValueInfo()->HasIntConstantValue() && instr->GetSrc1()->IsRegOpnd())
        {
            StackSym *sym = instr->GetSrc1()->AsRegOpnd()->m_sym;
            if (CurrentBlockData()->IsInt32TypeSpecialized(sym) == false)
            {
                // Type specializing a BrTrue_A/BrFalse_A isn't worth it, unless the src
                // is already type specialized
                specialize = false;
            }
        }
        if(instr->m_opcode == Js::OpCode::BrTrue_A)
        {
            UpdateIntBoundsForNotEqualBranch(src1Val, nullptr, 0);
            opcode = Js::OpCode::BrTrue_I4;
        }
        else
        {
            UpdateIntBoundsForEqualBranch(src1Val, nullptr, 0);
            opcode = Js::OpCode::BrFalse_I4;
        }
        if(!specialize)
        {
            return false;
        }

        newMin = 2; newMax = 1;  // We'll assert if we make a range where min > max
        break;
    }

    case Js::OpCode::MultiBr:
        newMin = min;
        newMax = max;
        opcode = instr->m_opcode;
        break;

    case Js::OpCode::StElemI_A:
    case Js::OpCode::StElemI_A_Strict:
    case Js::OpCode::StElemC:
        if(instr->GetDst()->AsIndirOpnd()->GetBaseOpnd()->GetValueType().IsLikelyAnyArrayWithNativeFloatValues())
        {
            src1Val = src1OriginalVal;
        }
        return TypeSpecializeStElem(pInstr, src1Val, pDstVal);

    case Js::OpCode::NewScArray:
    case Js::OpCode::NewScArrayWithMissingValues:
    case Js::OpCode::InitFld:
    case Js::OpCode::InitRootFld:
    case Js::OpCode::StSlot:
    case Js::OpCode::StSlotChkUndecl:
#if !FLOATVAR
    case Js::OpCode::StSlotBoxTemp:
#endif
    case Js::OpCode::StFld:
    case Js::OpCode::StRootFld:
    case Js::OpCode::StFldStrict:
    case Js::OpCode::StRootFldStrict:
    case Js::OpCode::ArgOut_A:
    case Js::OpCode::ArgOut_A_Inline:
    case Js::OpCode::ArgOut_A_FixupForStackArgs:
    case Js::OpCode::ArgOut_A_Dynamic:
    case Js::OpCode::ArgOut_A_FromStackArgs:
    case Js::OpCode::ArgOut_A_SpreadArg:
    // For this one we need to implement type specialization
    //case Js::OpCode::ArgOut_A_InlineBuiltIn:
    case Js::OpCode::Ret:
    case Js::OpCode::LdElemUndef:
    case Js::OpCode::LdElemUndefScoped:
        return false;

    default:
        if (OpCodeAttr::IsInlineBuiltIn(instr->m_opcode))
        {
            newMin = min;
            newMax = max;
            opcode = instr->m_opcode;
            break; // Note: we must keep checkTypeSpecWorth = false to make sure we never return false from this function.
        }
        return false;
    }

    // If this instruction is in a range of instructions where int overflow does not matter, we will still specialize it (won't
    // leave it unspecialized based on heuristics), since it is most likely worth specializing, and the dst value needs to be
    // guaranteed to be an int
    if(checkTypeSpecWorth &&
        !ignoredIntOverflow &&
        !ignoredNegativeZero &&
        instr->ShouldCheckForIntOverflow() &&
        !IsWorthSpecializingToInt32(instr, src1Val))
    {
        // Even though type specialization is being skipped since it may not be worth it, the proper value should still be
        // maintained so that the result may be type specialized later. An int value is not created for the dst in any of
        // the following cases.
        // - A bailout check is necessary to specialize this instruction. The bailout check is what guarantees the result to be
        //   an int, but since we're not going to specialize this instruction, there won't be a bailout check.
        // - Aggressive int type specialization is disabled and we're in a loop prepass. We're conservative on dst values in
        //   that case, especially if the dst sym is live on the back-edge.
        if(bailOutKind == IR::BailOutInvalid &&
            instr->GetDst() &&
            (DoAggressiveIntTypeSpec() || !this->IsLoopPrePass()))
        {
            *pDstVal = CreateDstUntransferredIntValue(newMin, newMax, instr, src1Val, nullptr);
        }

        if(instr->GetSrc2())
        {
            instr->FreeSrc2();
        }
        return false;
    }

    this->ignoredIntOverflowForCurrentInstr = ignoredIntOverflow;
    this->ignoredNegativeZeroForCurrentInstr = ignoredNegativeZero;

    {
        // Try CSE again before modifying the IR, in case some attributes are required for successful CSE
        Value *src1IndirIndexVal = nullptr;
        Value *src2Val = nullptr;
        if(CSEOptimize(currentBlock, &instr, &src1Val, &src2Val, &src1IndirIndexVal, true /* intMathExprOnly */))
        {
            *redoTypeSpecRef = true;
            return false;
        }
    }

    const Js::OpCode originalOpCode = instr->m_opcode;
    if (!this->IsLoopPrePass())
    {
        // No re-write on prepass
        instr->m_opcode = opcode;
    }

    Value *src1ValueToSpecialize = src1Val;
    if(lossy)
    {
        // Lossy conversions to int32 must be done based on the original source values. For instance, if one of the values is a
        // float constant with a value that fits in a uint32 but not an int32, and the instruction can ignore int overflow, the
        // source value for the purposes of int specialization would have been changed to an int constant value by ignoring
        // overflow. If we were to specialize the sym using the int constant value, it would be treated as a lossless
        // conversion, but since there may be subsequent uses of the same float constant value that may not ignore overflow,
        // this must be treated as a lossy conversion by specializing the sym using the original float constant value.
        src1ValueToSpecialize = src1OriginalVal;
    }

    // Make sure the srcs are specialized
    IR::Opnd *src1 = instr->GetSrc1();
    this->ToInt32(instr, src1, this->currentBlock, src1ValueToSpecialize, nullptr, lossy);

    if(bailOutKind != IR::BailOutInvalid && !this->IsLoopPrePass())
    {
        GenerateBailAtOperation(&instr, bailOutKind);
    }

    if (!skipDst)
    {
        IR::Opnd *dst = instr->GetDst();
        if (dst)
        {
            AssertMsg(!(isTransfer && !this->IsLoopPrePass()) || min == newMin && max == newMax, "If this is just a copy, old/new min/max should be the same");
            TypeSpecializeIntDst(
                instr,
                originalOpCode,
                isTransfer ? src1Val : nullptr,
                src1Val,
                nullptr,
                bailOutKind,
                newMin,
                newMax,
                pDstVal,
                addSubConstantInfo.HasInfo() ? &addSubConstantInfo : nullptr);
        }
    }

    if(bailOutKind == IR::BailOutInvalid)
    {
        GOPT_TRACE(_u("Type specialized to INT\n"));
#if ENABLE_DEBUG_CONFIG_OPTIONS
        if (Js::Configuration::Global.flags.TestTrace.IsEnabled(Js::AggressiveIntTypeSpecPhase))
        {
            Output::Print(_u("Type specialized to INT: "));
            Output::Print(_u("%s \n"), Js::OpCodeUtil::GetOpCodeName(instr->m_opcode));
        }
#endif
    }
    else
    {
        GOPT_TRACE(_u("Type specialized to INT with bailout on:\n"));
        if(bailOutKind & IR::BailOutOnOverflow)
        {
            GOPT_TRACE(_u("    Overflow\n"));
#if ENABLE_DEBUG_CONFIG_OPTIONS
            if (Js::Configuration::Global.flags.TestTrace.IsEnabled(Js::AggressiveIntTypeSpecPhase))
            {
                Output::Print(_u("Type specialized to INT with bailout (%S): "), "Overflow");
                Output::Print(_u("%s \n"), Js::OpCodeUtil::GetOpCodeName(instr->m_opcode));
            }
#endif
        }
        if(bailOutKind & IR::BailOutOnNegativeZero)
        {
            GOPT_TRACE(_u("    Zero\n"));
#if ENABLE_DEBUG_CONFIG_OPTIONS
            if (Js::Configuration::Global.flags.TestTrace.IsEnabled(Js::AggressiveIntTypeSpecPhase))
            {
                Output::Print(_u("Type specialized to INT with bailout (%S): "), "Zero");
                Output::Print(_u("%s \n"), Js::OpCodeUtil::GetOpCodeName(instr->m_opcode));
            }
#endif
        }
    }

    return true;
}